

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature.h
# Opt level: O3

void __thiscall flow::Signature::Signature(Signature *this,Signature *param_1)

{
  pointer pcVar1;
  
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar1 = (param_1->name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (param_1->name_)._M_string_length);
  this->returnType_ = param_1->returnType_;
  std::vector<flow::LiteralType,_std::allocator<flow::LiteralType>_>::vector
            (&this->args_,&param_1->args_);
  return;
}

Assistant:

Signature(const Signature&) = default;